

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-ctest.c
# Opt level: O3

void test09(char *infile,char *password,char *outfile,char *xarg)

{
  qpdf_read(qpdf,infile,password);
  qpdf_init_write(qpdf,outfile);
  qpdf_set_static_ID(qpdf,1);
  qpdf_set_stream_data_mode(qpdf,0);
  qpdf_write(qpdf);
  report_errors();
  return;
}

Assistant:

static void
test09(char const* infile, char const* password, char const* outfile, char const* xarg)
{
    qpdf_read(qpdf, infile, password);
    qpdf_init_write(qpdf, outfile);
    qpdf_set_static_ID(qpdf, QPDF_TRUE);
    qpdf_set_stream_data_mode(qpdf, qpdf_s_uncompress);
    qpdf_write(qpdf);
    report_errors();
}